

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_keygen_base(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey,int mac_nid)

{
  short *psVar1;
  undefined4 *key;
  int in_EDX;
  EVP_PKEY *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_key *keydata;
  gost_mac_pmeth_data *data;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int local_4;
  
  psVar1 = (short *)EVP_PKEY_CTX_get_data(in_RDI);
  if ((psVar1 == (short *)0x0) || (*psVar1 == 0)) {
    ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8,0);
    local_4 = 0;
  }
  else {
    key = (undefined4 *)
          CRYPTO_malloc(0x28,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                        ,0x3a4);
    if (key == (undefined4 *)0x0) {
      local_4 = 0;
    }
    else {
      *(undefined8 *)(key + 1) = *(undefined8 *)(psVar1 + 8);
      *(undefined8 *)(key + 3) = *(undefined8 *)(psVar1 + 0xc);
      *(undefined8 *)(key + 5) = *(undefined8 *)(psVar1 + 0x10);
      *(undefined8 *)(key + 7) = *(undefined8 *)(psVar1 + 0x14);
      *key = *(undefined4 *)(psVar1 + 2);
      *(short *)(key + 9) = psVar1[1];
      EVP_PKEY_assign(in_RSI,in_EDX,key);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_mac_keygen_base(EVP_PKEY_CTX *ctx,
                                     EVP_PKEY *pkey, int mac_nid)
{
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    struct gost_mac_key *keydata;
    if (!data || !data->key_set) {
        GOSTerr(GOST_F_PKEY_GOST_MAC_KEYGEN_BASE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    keydata = OPENSSL_malloc(sizeof(struct gost_mac_key));
    if (keydata == NULL)
        return 0;
    memcpy(keydata->key, data->key, 32);
    keydata->mac_param_nid = data->mac_param_nid;
    keydata->mac_size = data->mac_size;
    EVP_PKEY_assign(pkey, mac_nid, keydata);
    return 1;
}